

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::makeFCDAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doMakeFCD,UnicodeString *safeMiddle,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  char16_t *src_00;
  UChar *middleStart;
  undefined1 local_90 [8];
  UnicodeString middle;
  int32_t destSuffixLength;
  UChar *lastBoundaryInDest;
  UChar *firstBoundaryInSrc;
  ReorderingBuffer *buffer_local;
  UnicodeString *safeMiddle_local;
  UChar *pUStack_20;
  UBool doMakeFCD_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  UVar1 = ReorderingBuffer::isEmpty(buffer);
  pUVar3 = src;
  if ((UVar1 == '\0') &&
     (limit_local = findNextFCDBoundary(this,src,limit), pUVar3 = src, src != limit_local)) {
    pUVar3 = ReorderingBuffer::getStart(buffer);
    pUVar4 = ReorderingBuffer::getLimit(buffer);
    pUVar3 = findPreviousFCDBoundary(this,pUVar3,pUVar4);
    pUVar4 = ReorderingBuffer::getLimit(buffer);
    middle.fUnion._52_4_ = (undefined4)((ulong)((long)pUVar4 - (long)pUVar3) >> 1);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_90,pUVar3,middle.fUnion._52_4_);
    ReorderingBuffer::removeSuffix(buffer,middle.fUnion._52_4_);
    icu_63::UnicodeString::operator=(safeMiddle,(UnicodeString *)local_90);
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&middleStart,src);
    icu_63::UnicodeString::append
              ((UnicodeString *)local_90,(ConstChar16Ptr *)&middleStart,
               (int32_t)((ulong)((long)limit_local - (long)src) >> 1));
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&middleStart);
    src_00 = icu_63::UnicodeString::getBuffer((UnicodeString *)local_90);
    iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_90);
    makeFCD(this,src_00,src_00 + iVar2,buffer,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      limit_local = src;
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_90);
    pUVar3 = limit_local;
    if (UVar1 != '\0') {
      return;
    }
  }
  limit_local = pUVar3;
  if (doMakeFCD == '\0') {
    pUStack_20 = limit;
    if (limit == (UChar *)0x0) {
      pUStack_20 = u_strchr_63(limit_local,L'\0');
    }
    ReorderingBuffer::appendZeroCC(buffer,limit_local,pUStack_20,errorCode);
  }
  else {
    makeFCD(this,limit_local,limit,buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::makeFCDAndAppend(const UChar *src, const UChar *limit,
                                       UBool doMakeFCD,
                                       UnicodeString &safeMiddle,
                                       ReorderingBuffer &buffer,
                                       UErrorCode &errorCode) const {
    if(!buffer.isEmpty()) {
        const UChar *firstBoundaryInSrc=findNextFCDBoundary(src, limit);
        if(src!=firstBoundaryInSrc) {
            const UChar *lastBoundaryInDest=findPreviousFCDBoundary(buffer.getStart(),
                                                                    buffer.getLimit());
            int32_t destSuffixLength=(int32_t)(buffer.getLimit()-lastBoundaryInDest);
            UnicodeString middle(lastBoundaryInDest, destSuffixLength);
            buffer.removeSuffix(destSuffixLength);
            safeMiddle=middle;
            middle.append(src, (int32_t)(firstBoundaryInSrc-src));
            const UChar *middleStart=middle.getBuffer();
            makeFCD(middleStart, middleStart+middle.length(), &buffer, errorCode);
            if(U_FAILURE(errorCode)) {
                return;
            }
            src=firstBoundaryInSrc;
        }
    }
    if(doMakeFCD) {
        makeFCD(src, limit, &buffer, errorCode);
    } else {
        if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
            limit=u_strchr(src, 0);
        }
        buffer.appendZeroCC(src, limit, errorCode);
    }
}